

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O3

void Cec2_ManSaveCis(Gia_Man_t *p)

{
  int iVar1;
  Vec_Wrd_t *pVVar2;
  word wVar3;
  Vec_Int_t *pVVar4;
  word *pwVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  if (p->vSimsPi == (Vec_Wrd_t *)0x0) {
    __assert_fail("p->vSimsPi != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0x1fa,"void Cec2_ManSaveCis(Gia_Man_t *)");
  }
  iVar6 = p->nSimWords;
  if (0 < iVar6) {
    pVVar4 = p->vCis;
    lVar8 = 0;
    do {
      if (0 < pVVar4->nSize) {
        lVar9 = 0;
        do {
          iVar1 = pVVar4->pArray[lVar9];
          if ((iVar1 < 0) || (p->nObjs <= iVar1)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          iVar6 = p->nSimWords;
          if (iVar1 == 0) goto LAB_006503ef;
          uVar7 = iVar6 * iVar1;
          if (((int)uVar7 < 0) || (p->vSims->nSize <= (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          pVVar2 = p->vSimsPi;
          wVar3 = p->vSims->pArray[(ulong)uVar7 + lVar8];
          uVar7 = pVVar2->nSize;
          if (uVar7 == pVVar2->nCap) {
            if ((int)uVar7 < 0x10) {
              if (pVVar2->pArray == (word *)0x0) {
                pwVar5 = (word *)malloc(0x80);
              }
              else {
                pwVar5 = (word *)realloc(pVVar2->pArray,0x80);
              }
              pVVar2->pArray = pwVar5;
              if (pwVar5 == (word *)0x0) {
LAB_0065044b:
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                              ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
              }
              pVVar2->nCap = 0x10;
            }
            else {
              if (pVVar2->pArray == (word *)0x0) {
                pwVar5 = (word *)malloc((ulong)uVar7 << 4);
              }
              else {
                pwVar5 = (word *)realloc(pVVar2->pArray,(ulong)uVar7 << 4);
              }
              pVVar2->pArray = pwVar5;
              if (pwVar5 == (word *)0x0) goto LAB_0065044b;
              pVVar2->nCap = uVar7 * 2;
            }
          }
          else {
            pwVar5 = pVVar2->pArray;
          }
          iVar6 = pVVar2->nSize;
          pVVar2->nSize = iVar6 + 1;
          pwVar5[iVar6] = wVar3;
          lVar9 = lVar9 + 1;
          pVVar4 = p->vCis;
        } while (lVar9 < pVVar4->nSize);
        iVar6 = p->nSimWords;
      }
LAB_006503ef:
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar6);
  }
  return;
}

Assistant:

void Cec2_ManSaveCis( Gia_Man_t * p )
{
    int w, i, Id;
    assert( p->vSimsPi != NULL );
    for ( w = 0; w < p->nSimWords; w++ )
        Gia_ManForEachCiId( p, Id, i )
            Vec_WrdPush( p->vSimsPi, Cec2_ObjSim(p, Id)[w] );
}